

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::~IfcSimpleProperty(IfcSimpleProperty *this,void **vtt)

{
  void **vtt_local;
  IfcSimpleProperty *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSimpleProperty,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSimpleProperty,_0UL> *)
             &(this->super_IfcProperty).field_0x58,vtt + 5);
  IfcProperty::~IfcProperty(&this->super_IfcProperty,vtt + 1);
  return;
}

Assistant:

IfcSimpleProperty() : Object("IfcSimpleProperty") {}